

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::getContextPropertiesString
          (CLIntercept *this,cl_context_properties *properties,string *str)

{
  CEnumNameMap *this_00;
  long *plVar1;
  ulong *puVar2;
  undefined8 uVar3;
  char *__format;
  int e;
  ulong uVar4;
  void **pp;
  cl_bool *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string platformInfo;
  char s [256];
  string local_180;
  CLIntercept *local_160;
  string local_158;
  char local_138 [264];
  
  local_160 = this;
  std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x19e01f);
  if (properties == (cl_context_properties *)0x0) {
    std::__cxx11::string::_M_replace((ulong)str,0,(char *)str->_M_string_length,0x1a8ba0);
    return;
  }
  uVar4 = *properties;
  if (uVar4 != 0) {
    this_00 = &local_160->m_EnumNameMap;
    pcVar5 = (cl_bool *)(properties + 1);
    do {
      paVar6 = &local_180.field_2;
      e = (int)uVar4;
      CEnumNameMap::name_abi_cxx11_(&local_158,this_00,e);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_158);
      puVar2 = (ulong *)(plVar1 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar1 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar2) {
        local_180.field_2._M_allocated_capacity = *puVar2;
        local_180.field_2._8_8_ = plVar1[3];
        local_180._M_dataplus._M_p = (pointer)paVar6;
      }
      else {
        local_180.field_2._M_allocated_capacity = *puVar2;
        local_180._M_dataplus._M_p = (pointer)*plVar1;
      }
      local_180._M_string_length = plVar1[1];
      *plVar1 = (long)puVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::__cxx11::string::_M_append((char *)str,(ulong)local_180._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_180._M_dataplus._M_p != paVar6) {
        operator_delete(local_180._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if (e < 0x2032) {
        if (e - 0x2008U < 5) {
LAB_0016c049:
          uVar3 = *(undefined8 *)pcVar5;
          __format = "%p";
LAB_0016c060:
          snprintf(local_138,0x100,__format,uVar3);
        }
        else {
          if (e == 0x1084) {
            local_180._M_string_length = 0;
            local_180.field_2._M_allocated_capacity =
                 local_180.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_180._M_dataplus._M_p = (pointer)paVar6;
            getPlatformInfoString(local_160,*(cl_platform_id *)pcVar5,&local_180);
            std::__cxx11::string::_M_append((char *)str,(ulong)local_180._M_dataplus._M_p);
            goto LAB_0016c173;
          }
          if (e == 0x1085) goto LAB_0016c0df;
LAB_0016c103:
          snprintf(local_138,0x100,"<Unknown %08X!>",uVar4 & 0xffffffff);
        }
        std::__cxx11::string::append((char *)str);
      }
      else {
        if (e != 0x2032) {
          if (e == 0x40b0) goto LAB_0016c049;
          if (e != 0x40b1) goto LAB_0016c103;
          uVar3 = *(undefined8 *)pcVar5;
          __format = "%zu";
          goto LAB_0016c060;
        }
LAB_0016c0df:
        CEnumNameMap::name_bool_abi_cxx11_(&local_180,this_00,*pcVar5);
        std::__cxx11::string::_M_append((char *)str,(ulong)local_180._M_dataplus._M_p);
LAB_0016c173:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar6) {
          operator_delete(local_180._M_dataplus._M_p);
        }
      }
      if (*(long *)(pcVar5 + 2) != 0) {
        std::__cxx11::string::append((char *)str);
      }
      uVar4 = *(ulong *)(pcVar5 + 2);
      pcVar5 = pcVar5 + 4;
    } while (uVar4 != 0);
  }
  return;
}

Assistant:

void CLIntercept::getContextPropertiesString(
    const cl_context_properties* properties,
    std::string& str ) const
{
    str = "";

    if( properties )
    {
        char    s[256];

        while( properties[0] != 0 )
        {
            cl_int  property = (cl_int)properties[0];
            str += enumName().name( property ) + " = ";

            switch( property )
            {
            case CL_CONTEXT_PLATFORM:
                {
                    const cl_platform_id* pp = (const cl_platform_id*)( properties + 1 );
                    const cl_platform_id  platform = pp[0];
                    std::string platformInfo;
                    getPlatformInfoString( platform, platformInfo );
                    str += platformInfo;
                }
                break;
            case CL_GL_CONTEXT_KHR:
            case CL_EGL_DISPLAY_KHR:
            case CL_GLX_DISPLAY_KHR:
            case CL_WGL_HDC_KHR:
            case CL_CGL_SHAREGROUP_KHR:
#if defined(_WIN32)
            case CL_CONTEXT_D3D10_DEVICE_KHR:
            case CL_CONTEXT_D3D11_DEVICE_KHR:
            case CL_CONTEXT_ADAPTER_D3D9_KHR:
            case CL_CONTEXT_ADAPTER_D3D9EX_KHR:
            case CL_CONTEXT_ADAPTER_DXVA_KHR:
#endif
            case CL_PRINTF_CALLBACK_ARM:
                {
                    const void** pp = (const void**)( properties + 1 );
                    const void*  value = pp[0];
                    CLI_SPRINTF( s, 256, "%p", value );
                    str += s;
                }
                break;
            case CL_CONTEXT_INTEROP_USER_SYNC:
            case CL_CONTEXT_TERMINATE_KHR:
                {
                    const cl_bool*  pb = (const cl_bool*)( properties + 1);
                    cl_bool value = pb[0];
                    str += enumName().name_bool( value );
                }
                break;
            case CL_PRINTF_BUFFERSIZE_ARM:
                {
                    const size_t*   psz = (const size_t*)( properties + 1);
                    size_t value = psz[0];
                    CLI_SPRINTF( s, 256, "%zu", value );
                    str += s;
                }
                break;
            case CL_CONTEXT_MEMORY_INITIALIZE_KHR:
                // TODO: this is a cl_context_memory_initialize_khr bitfield.
                // Fall through for now.
            default:
                {
                    CLI_SPRINTF( s, 256, "<Unknown %08X!>", (cl_uint)property );
                    str += s;
                }
                break;
            }

            properties += 2;
            if( properties[0] != 0 )
            {
                str += ", ";
            }
        }
    }
    else
    {
        str = "NULL";
    }
}